

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeFractionFormat
          (ParsedPatternInfo *this,UErrorCode *status)

{
  ParserState *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  ParsedSubpatternInfo *pPVar3;
  UChar32 UVar4;
  uint uVar5;
  int leadingZeros;
  
  pPVar3 = this->currentSubpattern;
  this_00 = &this->state;
  leadingZeros = 0;
  do {
    UVar4 = ParserState::peek(this_00);
    if (UVar4 - 0x30U < 10) {
      if (0 < pPVar3->fractionHashSigns) {
        *status = U_FMT_PARSE_ERROR_START;
        return;
      }
      pPVar3->widthExceptAffixes = pPVar3->widthExceptAffixes + 1;
      pPVar3->fractionNumerals = pPVar3->fractionNumerals + 1;
      pPVar3->fractionTotal = pPVar3->fractionTotal + 1;
      UVar4 = ParserState::peek(this_00);
      if (UVar4 == 0x30) goto LAB_002a94b7;
      UVar4 = ParserState::peek(this_00);
      DecimalQuantity::appendDigit(&pPVar3->rounding,(char)UVar4 + -0x30,leadingZeros,false);
      leadingZeros = 0;
    }
    else {
      if (UVar4 != 0x23) {
        return;
      }
      pPVar3->widthExceptAffixes = pPVar3->widthExceptAffixes + 1;
      uVar1 = pPVar3->fractionHashSigns;
      uVar2 = pPVar3->fractionTotal;
      pPVar3->fractionHashSigns = uVar1 + 1;
      pPVar3->fractionTotal = uVar2 + 1;
LAB_002a94b7:
      leadingZeros = leadingZeros + 1;
    }
    uVar5 = ParserState::peek(this_00);
    (this->state).offset = ((this->state).offset - (uint)(uVar5 < 0x10000)) + 2;
  } while( true );
}

Assistant:

void ParsedPatternInfo::consumeFractionFormat(UErrorCode& status) {
    // Convenience reference:
    ParsedSubpatternInfo& result = *currentSubpattern;

    int32_t zeroCounter = 0;
    while (true) {
        switch (state.peek()) {
            case u'#':
                result.widthExceptAffixes += 1;
                result.fractionHashSigns += 1;
                result.fractionTotal += 1;
                zeroCounter++;
                break;

            case u'0':
            case u'1':
            case u'2':
            case u'3':
            case u'4':
            case u'5':
            case u'6':
            case u'7':
            case u'8':
            case u'9':
                if (result.fractionHashSigns > 0) {
                    state.toParseException(u"0 cannot follow # after decimal point");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.fractionNumerals += 1;
                result.fractionTotal += 1;
                if (state.peek() == u'0') {
                    zeroCounter++;
                } else {
                    result.rounding
                            .appendDigit(static_cast<int8_t>(state.peek() - u'0'), zeroCounter, false);
                    zeroCounter = 0;
                }
                break;

            default:
                return;
        }
        state.next(); // consume the symbol
    }
}